

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountShader::VaryingOutputCountShader
          (VaryingOutputCountShader *this,ContextType *contextType,VaryingSource source,
          int maxEmitCount,bool instanced)

{
  ShaderProgramDeclaration *pSVar1;
  char *__s;
  UniformSlot *pUVar2;
  undefined1 in_R9B;
  string local_398;
  GeometrySource local_378;
  GeometryShaderDeclaration local_358;
  allocator<char> local_339;
  string local_338;
  string local_318;
  FragmentSource local_2f8;
  string local_2d8;
  VertexSource local_2b8;
  FragmentOutput local_298;
  GeometryToFragmentVarying local_294;
  VertexToGeometryVarying local_28c;
  allocator<char> local_281;
  string local_280;
  VertexAttribute local_260;
  allocator<char> local_231;
  string local_230;
  VertexAttribute local_210;
  allocator<char> local_1e1;
  string local_1e0;
  Uniform local_1c0;
  allocator<char> local_181;
  string local_180;
  Uniform local_160;
  ShaderProgramDeclaration local_138;
  byte local_21;
  VaryingSource local_20;
  VaryingSource VStack_1c;
  bool instanced_local;
  int maxEmitCount_local;
  VaryingSource source_local;
  ContextType *contextType_local;
  VaryingOutputCountShader *this_local;
  
  local_21 = instanced;
  local_20 = maxEmitCount;
  VStack_1c = source;
  _maxEmitCount_local = (VaryingOutputCountShader *)contextType;
  contextType_local = (ContextType *)this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"u_sampler",&local_181);
  sglr::pdec::Uniform::Uniform(&local_160,&local_180,TYPE_SAMPLER_2D);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_138,&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"u_emitCount",&local_1e1);
  sglr::pdec::Uniform::Uniform(&local_1c0,&local_1e0,TYPE_INT_VEC4);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"a_position",&local_231);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_210,&local_230,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_210);
  __s = getAttributeName(VStack_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,__s,&local_281);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_260,&local_280,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_260);
  sglr::pdec::VertexToGeometryVarying::VertexToGeometryVarying(&local_28c,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_28c);
  sglr::pdec::GeometryToFragmentVarying::GeometryToFragmentVarying
            (&local_294,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_294);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_298,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_298);
  Functional::(anonymous_namespace)::VaryingOutputCountShader::genVertexSource_abi_cxx11_
            (&local_2d8,_maxEmitCount_local,(ContextType *)(ulong)VStack_1c,maxEmitCount);
  sglr::pdec::VertexSource::VertexSource(&local_2b8,&local_2d8);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_339);
  specializeShader(&local_318,&local_338,(ContextType *)_maxEmitCount_local);
  sglr::pdec::FragmentSource::FragmentSource(&local_2f8,&local_318);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f8);
  sglr::pdec::GeometryShaderDeclaration::GeometryShaderDeclaration
            (&local_358,GEOMETRYSHADERINPUTTYPE_POINTS,GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP,
             (long)(int)local_20,(ulong)(local_21 & 1) * 3 + 1);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_358);
  Functional::(anonymous_namespace)::VaryingOutputCountShader::genGeometrySource_abi_cxx11_
            (&local_398,_maxEmitCount_local,(ContextType *)(ulong)VStack_1c,local_20,local_21 & 1,
             (bool)in_R9B);
  sglr::pdec::GeometrySource::GeometrySource(&local_378,&local_398);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_378);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::GeometrySource::~GeometrySource(&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  sglr::pdec::FragmentSource::~FragmentSource(&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  sglr::pdec::VertexSource::~VertexSource(&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  sglr::pdec::Uniform::~Uniform(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  sglr::pdec::Uniform::~Uniform(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_138);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bd958;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bd990;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bd9a8;
  *(VaryingSource *)&(this->super_ShaderProgram).field_0x154 = VStack_1c;
  pUVar2 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_sampler");
  this->m_sampler = pUVar2;
  pUVar2 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_emitCount");
  this->m_emitCount = pUVar2;
  this->m_maxEmitCount = local_20;
  this->m_instanced = (bool)(local_21 & 1);
  return;
}

Assistant:

VaryingOutputCountShader::VaryingOutputCountShader (const glu::ContextType& contextType, VaryingSource source, int maxEmitCount, bool instanced)
	: sglr::ShaderProgram	(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::Uniform("u_sampler", glu::TYPE_SAMPLER_2D)
							<< sglr::pdec::Uniform("u_emitCount", glu::TYPE_INT_VEC4)
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute(getAttributeName(source), rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(genVertexSource(contextType, source))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(rr::GEOMETRYSHADERINPUTTYPE_POINTS,
																	 rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP,
																	 maxEmitCount,
																	 (instanced) ? (4) : (1))
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, source, maxEmitCount, instanced)))
	, m_test				(source)
	, m_sampler				(getUniformByName("u_sampler"))
	, m_emitCount			(getUniformByName("u_emitCount"))
	, m_maxEmitCount		(maxEmitCount)
	, m_instanced			(instanced)
{
}